

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_c1df::read_stdio_prealloc
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          char *file_name)

{
  size_type __n;
  int iVar1;
  system_error *psVar2;
  int *piVar3;
  error_category *peVar4;
  uchar *__ptr;
  size_t sVar5;
  size_t bytes_read;
  size_type local_38;
  size_t file_size;
  FILE *local_20;
  FILE *file;
  char *file_name_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *output;
  
  file = (FILE *)file_name;
  file_name_local = (char *)__return_storage_ptr__;
  local_20 = fopen(file_name,"rb");
  if (local_20 == (FILE *)0x0) {
    psVar2 = (system_error *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    peVar4 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(psVar2,iVar1,peVar4);
    __cxa_throw(psVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  iVar1 = fseek(local_20,0,2);
  if (iVar1 == 0) {
    local_38 = ftell(local_20);
    rewind(local_20);
    __n = local_38;
    bytes_read._7_1_ = 0;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&bytes_read + 6));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,__n,(allocator<unsigned_char> *)((long)&bytes_read + 6));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&bytes_read + 6));
    __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(__return_storage_ptr__)
    ;
    sVar5 = fread(__ptr,1,local_38,local_20);
    if (sVar5 == local_38) {
      fclose(local_20);
      return __return_storage_ptr__;
    }
    fclose(local_20);
    psVar2 = (system_error *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    peVar4 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(psVar2,iVar1,peVar4);
    __cxa_throw(psVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  fclose(local_20);
  psVar2 = (system_error *)__cxa_allocate_exception(0x20);
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  peVar4 = (error_category *)std::_V2::system_category();
  std::system_error::system_error(psVar2,iVar1,peVar4);
  __cxa_throw(psVar2,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::vector<std::uint8_t> read_stdio_prealloc(const char* file_name)
{
    FILE* file = std::fopen(file_name, "rb");
    if (!file) {
        throw std::system_error{errno, std::system_category()};
    }
    // Seek to the end of the stream to find the size
    if (std::fseek(file, 0, SEEK_END) != 0) {
        std::fclose(file);
        throw std::system_error{errno, std::system_category()};
    }
    std::size_t file_size = std::ftell(file);
    std::rewind(file);

    std::vector<std::uint8_t> output(file_size);
    std::size_t bytes_read = std::fread(output.data(), 1, file_size, file);

    if (bytes_read != file_size) {
        std::fclose(file);
        throw std::system_error{errno, std::system_category()};
    }

    std::fclose(file);

    return output;
}